

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O1

bool __thiscall cmdline::parser::parse(parser *this,int argc,char **argv)

{
  undefined1 uVar1;
  size_type __len1;
  char cVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  mapped_type *ppoVar8;
  size_type sVar9;
  char *pcVar10;
  const_iterator cVar11;
  _Base_ptr p_Var12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  _Base_ptr p_Var14;
  _Base_ptr p_Var15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  _Base_ptr p_Var17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  long lVar19;
  undefined8 uVar20;
  _Alloc_hider _Var21;
  _Self __tmp;
  long lVar22;
  char *pcVar23;
  int iVar24;
  _Self __tmp_1;
  bool bVar25;
  char initial;
  string name;
  string val;
  char last;
  map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  lookup;
  char local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  parser *local_a8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_a0;
  int local_94;
  _Base_ptr local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [32];
  _Base_ptr local_48;
  size_t local_40;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_38;
  
  local_a0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->errors;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_a0,
                    (this->errors).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  local_38 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->others;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_38,
                    (this->others).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  local_94 = argc;
  if (argc < 1) {
    local_68._0_8_ = local_68 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"argument number must be longer than 0","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_68);
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_,(ulong)(local_68._16_8_ + 1));
    }
    bVar25 = false;
  }
  else {
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&this->prog_name,"");
    if (iVar3 == 0) {
      pcVar23 = *argv;
      __len1 = (this->prog_name)._M_string_length;
      sVar5 = strlen(pcVar23);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (&this->prog_name,0,__len1,pcVar23,sVar5);
    }
    local_68._24_8_ = local_68 + 8;
    local_68._8_4_ = _S_red;
    local_68._16_8_ = (_Base_ptr)0x0;
    local_40 = 0;
    p_Var7 = (this->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_90 = &(this->options)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_a8 = this;
    local_48 = (_Base_ptr)local_68._24_8_;
    if (p_Var7 != local_90) {
      do {
        if ((p_Var7[1]._M_parent != (_Base_ptr)0x0) &&
           (local_e9 = (**(code **)(**(long **)(p_Var7 + 2) + 0x48))(), local_e9 != '\0')) {
          p_Var17 = (_Base_ptr)(local_68 + 8);
          p_Var15 = p_Var17;
          for (p_Var12 = (_Base_ptr)local_68._16_8_; p_Var12 != (_Base_ptr)0x0;
              p_Var12 = (&p_Var12->_M_left)[(char)uVar1 < local_e9]) {
            uVar1 = (undefined1)p_Var12[1]._M_color;
            if (local_e9 <= (char)uVar1) {
              p_Var15 = p_Var12;
            }
          }
          p_Var12 = p_Var17;
          if ((p_Var15 != p_Var17) && (p_Var12 = p_Var15, local_e9 < (char)p_Var15[1]._M_color)) {
            p_Var12 = p_Var17;
          }
          if (p_Var12 != p_Var17) {
            pmVar6 = std::
                     map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_68,&local_e9);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_replace(pmVar6,0,pmVar6->_M_string_length,"",0);
            local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_88,"short option \'","");
            pbVar13 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                      _M_replace_aux(&local_88,local_88._M_string_length,0,1,local_e9);
            local_c8._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
            paVar18 = &pbVar13->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p == paVar18) {
              local_c8.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
              local_c8.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
              local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            }
            else {
              local_c8.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
            }
            local_c8._M_string_length = pbVar13->_M_string_length;
            (pbVar13->_M_dataplus)._M_p = (pointer)paVar18;
            pbVar13->_M_string_length = 0;
            (pbVar13->field_2)._M_local_buf[0] = '\0';
            pbVar13 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                (&local_c8,"\' is ambiguous");
            local_e8._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
            paVar18 = &pbVar13->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p == paVar18) {
              local_e8.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
              local_e8.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
              local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            }
            else {
              local_e8.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
            }
            local_e8._M_string_length = pbVar13->_M_string_length;
            (pbVar13->_M_dataplus)._M_p = (pointer)paVar18;
            pbVar13->_M_string_length = 0;
            (pbVar13->field_2)._M_local_buf[0] = '\0';
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_a0,&local_e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            }
            bVar25 = false;
            goto LAB_00132fd2;
          }
          pmVar6 = std::
                   map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_68,&local_e9);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (pmVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (p_Var7 + 1));
        }
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      } while (p_Var7 != local_90);
    }
    if (local_94 != 1) {
      iVar3 = 1;
      do {
        pcVar23 = argv[iVar3];
        iVar4 = strncmp(pcVar23,"--",2);
        iVar24 = iVar3;
        if (iVar4 == 0) {
          pcVar23 = pcVar23 + 2;
          pcVar10 = strchr(pcVar23,0x3d);
          if (pcVar10 == (char *)0x0) {
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            sVar5 = strlen(pcVar23);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e8,pcVar23,pcVar23 + sVar5);
            cVar11 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                             *)local_a8,&local_e8);
            if (cVar11._M_node == local_90) {
              std::operator+(&local_c8,"undefined option: --",&local_e8);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>(local_a0,&local_c8);
              goto LAB_001329f2;
            }
            ppoVar8 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                      ::operator[](&local_a8->options,&local_e8);
            iVar4 = (*(*ppoVar8)->_vptr_option_base[2])();
            if ((char)iVar4 == '\0') {
              set_option(local_a8,&local_e8);
            }
            else {
              iVar24 = iVar3 + 1;
              if (local_94 <= iVar24) {
                std::operator+(&local_c8,"option needs value: --",&local_e8);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>(local_a0,&local_c8);
                goto LAB_001329f2;
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_c8,argv[iVar24],(allocator<char> *)&local_88);
              set_option(local_a8,&local_e8,&local_c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1
                               );
              }
            }
          }
          else {
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,pcVar23,pcVar10);
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            sVar5 = strlen(pcVar10 + 1);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c8,pcVar10 + 1,pcVar10 + sVar5 + 1);
            set_option(local_a8,&local_e8,&local_c8);
LAB_001329f2:
            iVar24 = iVar3;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
        }
        else if (*pcVar23 == '-') {
          if (pcVar23[1] != '\0') {
            local_88._M_dataplus._M_p._0_1_ = pcVar23[1];
            cVar2 = argv[iVar3][2];
            bVar25 = cVar2 == '\0';
            if (!bVar25) {
              lVar22 = 2;
              lVar19 = 1;
              do {
                if ((byte)(cVar2 - 0x30U) < 10) {
                  pmVar6 = std::
                           map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)local_68,(key_type *)&local_88);
                  ppoVar8 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                            ::operator[](&local_a8->options,pmVar6);
                  iVar4 = (*(*ppoVar8)->_vptr_option_base[2])();
                  if ((char)iVar4 != '\0') {
                    pmVar6 = std::
                             map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)local_68,(key_type *)&local_88);
                    pcVar23 = argv[iVar3] + lVar22;
                    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                    sVar5 = strlen(pcVar23);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_e8,pcVar23,pcVar23 + sVar5);
                    set_option(local_a8,pmVar6,&local_e8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                      operator_delete(local_e8._M_dataplus._M_p,
                                      local_e8.field_2._M_allocated_capacity + 1);
                    }
                    break;
                  }
                }
                local_88._M_dataplus._M_p._0_1_ = argv[iVar3][lVar22];
                sVar9 = std::
                        map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::count((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_68,argv[iVar3] + lVar19);
                if (sVar9 == 0) {
                  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_c8,"undefined short option: -","");
                  pbVar13 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            _M_replace_aux(&local_c8,local_c8._M_string_length,0,1,
                                           argv[iVar3][lVar19]);
                  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                  paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(pbVar13->_M_dataplus)._M_p;
                  paVar16 = &pbVar13->field_2;
                  if (paVar18 == paVar16) {
                    local_e8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                    local_e8.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
                  }
                  else {
                    local_e8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                    local_e8._M_dataplus._M_p = (pointer)paVar18;
                  }
                  local_e8._M_string_length = pbVar13->_M_string_length;
                  (pbVar13->_M_dataplus)._M_p = (pointer)paVar16;
                  pbVar13->_M_string_length = 0;
                  (pbVar13->field_2)._M_local_buf[0] = '\0';
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>(local_a0,&local_e8);
LAB_00132922:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                    operator_delete(local_e8._M_dataplus._M_p,
                                    local_e8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                    operator_delete(local_c8._M_dataplus._M_p,
                                    local_c8.field_2._M_allocated_capacity + 1);
                  }
                }
                else {
                  pmVar6 = std::
                           map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)local_68,argv[iVar3] + lVar19);
                  iVar4 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                    (pmVar6,"");
                  if (iVar4 == 0) {
                    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_c8,"ambiguous short option: -","");
                    pbVar13 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              _M_replace_aux(&local_c8,local_c8._M_string_length,0,1,
                                             argv[iVar3][lVar19]);
                    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                    paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(pbVar13->_M_dataplus)._M_p;
                    paVar16 = &pbVar13->field_2;
                    if (paVar18 == paVar16) {
                      local_e8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                      local_e8.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
                    }
                    else {
                      local_e8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                      local_e8._M_dataplus._M_p = (pointer)paVar18;
                    }
                    local_e8._M_string_length = pbVar13->_M_string_length;
                    (pbVar13->_M_dataplus)._M_p = (pointer)paVar16;
                    pbVar13->_M_string_length = 0;
                    (pbVar13->field_2)._M_local_buf[0] = '\0';
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>(local_a0,&local_e8);
                    goto LAB_00132922;
                  }
                  pmVar6 = std::
                           map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)local_68,argv[iVar3] + lVar19);
                  set_option(local_a8,pmVar6);
                }
                lVar22 = lVar22 + 1;
                cVar2 = argv[iVar3][lVar19 + 2];
                lVar19 = lVar19 + 1;
                bVar25 = cVar2 == '\0';
              } while (!bVar25);
            }
            p_Var7 = (_Base_ptr)(local_68 + 8);
            p_Var12 = p_Var7;
            for (p_Var17 = (_Base_ptr)local_68._16_8_; p_Var17 != (_Base_ptr)0x0;
                p_Var17 = (&p_Var17->_M_left)[(char)uVar1 < (char)local_88._M_dataplus._M_p]) {
              uVar1 = (undefined1)p_Var17[1]._M_color;
              if ((char)local_88._M_dataplus._M_p <= (char)uVar1) {
                p_Var12 = p_Var17;
              }
            }
            p_Var17 = p_Var7;
            if ((p_Var12 != p_Var7) &&
               (p_Var17 = p_Var12, (char)local_88._M_dataplus._M_p < (char)p_Var12[1]._M_color)) {
              p_Var17 = p_Var7;
            }
            paVar18 = &local_e8.field_2;
            if (p_Var17 == p_Var7) {
              local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_c8,"undefined short option: -","");
              pbVar13 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                        _M_replace_aux(&local_c8,local_c8._M_string_length,0,1,
                                       (char)local_88._M_dataplus._M_p);
              local_e8._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
              paVar16 = &pbVar13->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p == paVar16) {
                local_e8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                local_e8.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
                local_e8._M_dataplus._M_p = (pointer)paVar18;
              }
              else {
                local_e8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
              }
              local_e8._M_string_length = pbVar13->_M_string_length;
              (pbVar13->_M_dataplus)._M_p = (pointer)paVar16;
              pbVar13->_M_string_length = 0;
              (pbVar13->field_2)._M_local_buf[0] = '\0';
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>(local_a0,&local_e8);
            }
            else {
              pmVar6 = std::
                       map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)local_68,(key_type *)&local_88);
              iVar4 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (pmVar6,"");
              if (iVar4 != 0) {
                if (bVar25) {
                  iVar24 = iVar3 + 1;
                  if (iVar24 < local_94) {
                    pmVar6 = std::
                             map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)local_68,(key_type *)&local_88);
                    ppoVar8 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                              ::operator[](&local_a8->options,pmVar6);
                    iVar4 = (*(*ppoVar8)->_vptr_option_base[2])();
                    if ((char)iVar4 != '\0') {
                      pmVar6 = std::
                               map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)local_68,(key_type *)&local_88);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_e8,argv[iVar24],(allocator<char> *)&local_c8);
                      set_option(local_a8,pmVar6,&local_e8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_e8._M_dataplus._M_p != paVar18) {
                        operator_delete(local_e8._M_dataplus._M_p,
                                        local_e8.field_2._M_allocated_capacity + 1);
                      }
                      goto LAB_00132eae;
                    }
                  }
                  pmVar6 = std::
                           map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)local_68,(key_type *)&local_88);
                  set_option(local_a8,pmVar6);
                  iVar24 = iVar3;
                }
                goto LAB_00132eae;
              }
              local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_c8,"ambiguous short option: -","");
              pbVar13 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                        _M_replace_aux(&local_c8,local_c8._M_string_length,0,1,
                                       (char)local_88._M_dataplus._M_p);
              local_e8._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
              paVar16 = &pbVar13->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p == paVar16) {
                local_e8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                local_e8.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
                local_e8._M_dataplus._M_p = (pointer)paVar18;
              }
              else {
                local_e8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
              }
              local_e8._M_string_length = pbVar13->_M_string_length;
              (pbVar13->_M_dataplus)._M_p = (pointer)paVar16;
              pbVar13->_M_string_length = 0;
              (pbVar13->field_2)._M_local_buf[0] = '\0';
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>(local_a0,&local_e8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != paVar18) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            uVar20 = local_c8.field_2._M_allocated_capacity;
            _Var21._M_p = local_c8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) goto LAB_00132ea1;
          }
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e8,pcVar23,(allocator<char> *)&local_c8);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_38,&local_e8);
          uVar20 = local_e8.field_2._M_allocated_capacity;
          _Var21._M_p = local_e8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
LAB_00132ea1:
            operator_delete(_Var21._M_p,uVar20 + 1);
          }
        }
LAB_00132eae:
        iVar3 = iVar24 + 1;
      } while (iVar3 < local_94);
    }
    p_Var14 = (local_a8->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (p_Var14 != local_90) {
      do {
        cVar2 = (**(code **)(**(long **)(p_Var14 + 2) + 0x30))();
        if (cVar2 == '\0') {
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c8,*(long *)(p_Var14 + 1),
                     (long)&(p_Var14[1]._M_parent)->_M_color + *(long *)(p_Var14 + 1));
          pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace(&local_c8,0,0,"need option: --",0xf);
          local_e8._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
          paVar18 = &pbVar13->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p == paVar18) {
            local_e8.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
            local_e8.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          }
          else {
            local_e8.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
          }
          local_e8._M_string_length = pbVar13->_M_string_length;
          (pbVar13->_M_dataplus)._M_p = (pointer)paVar18;
          pbVar13->_M_string_length = 0;
          (pbVar13->field_2)._M_local_buf[0] = '\0';
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_a0,&local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
        }
        p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
      } while (p_Var14 != local_90);
    }
    bVar25 = (local_a8->errors).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish ==
             (local_a8->errors).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
LAB_00132fd2:
    std::
    _Rb_tree<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_68);
  }
  return bVar25;
}

Assistant:

bool parse(int argc, const char *const argv[]) {
    errors.clear();
    others.clear();

    if (argc < 1) {
      errors.push_back("argument number must be longer than 0");
      return false;
    }
    if (prog_name == "")
      prog_name = argv[0];

    std::map<char, std::string> lookup;
    for (std::map<std::string, option_base *>::iterator p = options.begin();
         p != options.end(); p++) {
      if (p->first.length() == 0)
        continue;
      char initial = p->second->short_name();
      if (initial) {
        if (lookup.count(initial) > 0) {
          lookup[initial] = "";
          errors.push_back(std::string("short option '") + initial +
                           "' is ambiguous");
          return false;
        }
        else
          lookup[initial] = p->first;
      }
    }

    for (int i = 1; i < argc; i++) {
      if (strncmp(argv[i], "--", 2) == 0) {
        const char *p = strchr(argv[i] + 2, '=');
        if (p) {
          std::string name(argv[i] + 2, p);
          std::string val(p + 1);
          set_option(name, val);
        }
        else {
          std::string name(argv[i] + 2);
          if (options.count(name) == 0) {
            errors.push_back("undefined option: --" + name);
            continue;
          }
          if (options[name]->has_value()) {
            if (i + 1 >= argc) {
              errors.push_back("option needs value: --" + name);
              continue;
            }
            else {
              i++;
              set_option(name, argv[i]);
            }
          }
          else {
            set_option(name);
          }
        }
      }
      else if (strncmp(argv[i], "-", 1) == 0) {
        if (!argv[i][1])
          continue;
        char last = argv[i][1];
        bool jump_next = false;
        for (int j = 2; argv[i][j]; j++) {
          if (argv[i][j] >= '0' && argv[i][j] <= '9' &&
              options[lookup[last]]->has_value()) {
            set_option(lookup[last], &argv[i][j]);
            jump_next = true;
            break;
          }
          last = argv[i][j];
          if (lookup.count(argv[i][j - 1]) == 0) {
            errors.push_back(std::string("undefined short option: -") +
                             argv[i][j - 1]);
            continue;
          }
          if (lookup[argv[i][j - 1]] == "") {
            errors.push_back(std::string("ambiguous short option: -") +
                             argv[i][j - 1]);
            continue;
          }
          set_option(lookup[argv[i][j - 1]]);
        }

        if (lookup.count(last) == 0) {
          errors.push_back(std::string("undefined short option: -") + last);
          continue;
        }
        if (lookup[last] == "") {
          errors.push_back(std::string("ambiguous short option: -") + last);
          continue;
        }
        if (jump_next) {
          continue;
        }
        if (i + 1 < argc && options[lookup[last]]->has_value()) {
          set_option(lookup[last], argv[i + 1]);
          i++;
        }
        else {
          set_option(lookup[last]);
        }
      }
      else {
        others.push_back(argv[i]);
      }
    }

    for (std::map<std::string, option_base *>::iterator p = options.begin();
         p != options.end(); p++)
      if (!p->second->valid())
        errors.push_back("need option: --" + std::string(p->first));

    return errors.size() == 0;
  }